

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

int __thiscall CVmFormatterLog::close_log_file(CVmFormatterLog *this)

{
  long lVar1;
  void *pvVar2;
  uint uVar3;
  int in_ESI;
  long *in_FS_OFFSET;
  bool bVar4;
  err_frame_t err_cur__;
  uint local_100 [2];
  long local_f8;
  void *local_f0;
  __jmp_buf_tag local_e8;
  
  if ((FILE *)this->logfp_ != (FILE *)0x0) {
    fclose((FILE *)this->logfp_);
    this->logfp_ = (osfildef *)0x0;
  }
  if (this->lognf_ == (CVmNetFile *)0x0) {
    uVar3 = 0;
  }
  else {
    G_err_frame::__tls_init();
    local_f8 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_100;
    local_100[0] = _setjmp(&local_e8);
    if (local_100[0] == 0) {
      CVmNetFile::close(this->lognf_,in_ESI);
    }
    lVar1 = local_f8;
    bVar4 = local_100[0] == 1;
    if (bVar4) {
      local_100[0] = 2;
    }
    uVar3 = (uint)bVar4;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar1;
    if ((local_100[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar2 = local_f0;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_100[0] & 2) != 0) {
      free(local_f0);
    }
    this->lognf_ = (CVmNetFile *)0x0;
  }
  if (this->logglob_ != (vm_globalvar_t *)0x0) {
    (this->logglob_->val).typ = VM_NIL;
  }
  return uVar3;
}

Assistant:

int CVmFormatterLog::close_log_file(VMG0_)
{
    /* presume success */
    int err = FALSE;
    
    /* if we have a file, close it */
    if (logfp_ != 0)
    {
        /* close and forget the handle */
        osfcls(logfp_);
        logfp_ = 0;
    }

    /* forget the log network file descriptor, if we have one */
    if (lognf_ != 0)
    {
        err_try
        {
            lognf_->close(vmg0_);
        }
        err_catch_disc
        {
            /* flag the error, but otherwise discard the exception */
            err = TRUE;
        }